

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

int Wlc_BlastLessSigned(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits)

{
  int iCtrl;
  int iVar1;
  int in_register_00000004;
  int Yes;
  int iStack_38;
  int local_34;
  
  local_34 = in_register_00000004;
  iCtrl = Gia_ManHashXor(pNew,pArg0[(long)nBits + -1],pArg1[(long)nBits + -1]);
  iVar1 = pArg0[(long)nBits + -1];
  if (nBits + -1 == 0) {
    local_34 = 0;
  }
  else {
    Wlc_BlastLess_rec(pNew,pArg0,pArg1,nBits + -1,&local_34,&iStack_38);
  }
  iVar1 = Gia_ManHashMux(pNew,iCtrl,iVar1,local_34);
  return iVar1;
}

Assistant:

int Wlc_BlastLessSigned( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits )
{
    int iDiffSign = Gia_ManHashXor( pNew, pArg0[nBits-1], pArg1[nBits-1] );
    return Gia_ManHashMux( pNew, iDiffSign, pArg0[nBits-1], Wlc_BlastLess(pNew, pArg0, pArg1, nBits-1) );
}